

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Point2f __thiscall
pbrt::WindowedPiecewiseConstant2D::Sample
          (WindowedPiecewiseConstant2D *this,Point2f *u,Bounds2f *b,Float *pdf)

{
  float fVar1;
  undefined1 auVar2 [16];
  anon_class_24_3_6b44205e P;
  anon_class_24_3_03b17d9d P_00;
  Float FVar3;
  Point2f PVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  Float bInt;
  Point2f p;
  Bounds2f bCond;
  Float condIntegral;
  Float local_7c;
  Tuple2<pbrt::Point2,_float> local_78;
  Bounds2f local_70;
  Float local_5c;
  WindowedPiecewiseConstant2D *local_58;
  Bounds2f *pBStack_50;
  Float *local_48;
  WindowedPiecewiseConstant2D *local_40;
  Bounds2f *pBStack_38;
  Float *local_30;
  
  FVar3 = SummedAreaTable::Integral(&this->sat,b);
  if ((FVar3 != 0.0) || (NAN(FVar3))) {
    local_7c = SummedAreaTable::Integral(&this->sat,b);
    local_30 = &local_7c;
    local_78.x = 0.0;
    local_78.y = 0.0;
    P.b = b;
    P.this = this;
    P.bInt = local_30;
    local_40 = this;
    pBStack_38 = b;
    FVar3 = SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_1_>
                      (P,(u->super_Tuple2<pbrt::Point2,_float>).x,
                       (b->pMin).super_Tuple2<pbrt::Point2,_float>.x,
                       (b->pMax).super_Tuple2<pbrt::Point2,_float>.x,
                       (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                       (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    local_78.x = FVar3;
    fVar6 = (float)((this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                   (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x);
    fVar1 = FVar3 * fVar6;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
    auVar7._0_4_ = auVar2._0_4_ / fVar6;
    auVar7._4_12_ = auVar2._4_12_;
    auVar2 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),10);
    auVar5._0_4_ = auVar2._0_4_ / fVar6;
    auVar5._4_12_ = auVar2._4_12_;
    auVar2 = vinsertps_avx(auVar5,ZEXT416((uint)(b->pMax).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar5 = vinsertps_avx(auVar7,ZEXT416((uint)(b->pMin).super_Tuple2<pbrt::Point2,_float>.y),0x10)
    ;
    auVar7 = vminps_avx(auVar2,auVar5);
    auVar2 = vmaxps_avx(auVar2,auVar5);
    local_70 = (Bounds2f)vmovlhps_avx(auVar7,auVar2);
    if ((local_70.pMin.super_Tuple2<pbrt::Point2,_float>.x ==
         local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x) &&
       (!NAN(local_70.pMin.super_Tuple2<pbrt::Point2,_float>.x) &&
        !NAN(local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x))) {
      local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x =
           1.0 / fVar6 + local_70.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    }
    FVar3 = SummedAreaTable::Integral(&this->sat,&local_70);
    if ((FVar3 != 0.0) || (NAN(FVar3))) {
      local_5c = SummedAreaTable::Integral(&this->sat,&local_70);
      local_48 = &local_5c;
      P_00.bCond = &local_70;
      P_00.this = this;
      P_00.condIntegral = local_48;
      local_58 = this;
      pBStack_50 = &local_70;
      FVar3 = SampleBisection<pbrt::WindowedPiecewiseConstant2D::Sample(pbrt::Point2<float>const&,pbrt::Bounds2<float>const&,float*)const::_lambda(float)_2_>
                        (P_00,(u->super_Tuple2<pbrt::Point2,_float>).y,
                         (b->pMin).super_Tuple2<pbrt::Point2,_float>.y,
                         (b->pMax).super_Tuple2<pbrt::Point2,_float>.y,
                         (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                         (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
      local_78.y = FVar3;
      FVar3 = Eval(this,(Point2f *)&local_78);
      *pdf = FVar3 / local_7c;
      return (Point2f)local_78;
    }
  }
  *pdf = 0.0;
  PVar4.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  PVar4.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  return (Point2f)PVar4.super_Tuple2<pbrt::Point2,_float>;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sample(const Point2f &u, const Bounds2f &b, Float *pdf) const {
        // Handle zero-valued function for windowed sampling
        if (sat.Integral(b) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function _Px_ for marginal cumulative distribution
        Float bInt = sat.Integral(b);
        auto Px = [&, this](Float x) -> Float {
            Bounds2f bx = b;
            bx.pMax.x = x;
            return sat.Integral(bx) / bInt;
        };

        // Sample marginal windowed function in $x$
        Point2f p;
        p.x = SampleBisection(Px, u[0], b.pMin.x, b.pMax.x, func.xSize());

        // Sample conditional windowed function in $y$
        // Compute 2D bounds _bCond_ for conditional sampling
        int nx = func.xSize();
        Bounds2f bCond(Point2f(std::floor(p.x * nx) / nx, b.pMin.y),
                       Point2f(std::ceil(p.x * nx) / nx, b.pMax.y));
        if (bCond.pMin.x == bCond.pMax.x)
            bCond.pMax.x += 1.f / nx;
        if (sat.Integral(bCond) == 0) {
            *pdf = 0;
            return {};
        }

        // Define lambda function for conditional distribution and sample $y$
        Float condIntegral = sat.Integral(bCond);
        auto Py = [&, this](Float y) -> Float {
            Bounds2f by = bCond;
            by.pMax.y = y;
            return sat.Integral(by) / condIntegral;
        };
        p.y = SampleBisection(Py, u[1], b.pMin.y, b.pMax.y, func.ySize());

        // Compute PDF and return point sampled from windowed function
        *pdf = Eval(p) / bInt;
        return p;
    }